

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_bitstring(uchar **p,uchar *end,mbedtls_asn1_bitstring *bs)

{
  byte bVar1;
  uchar *puVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  
  puVar2 = *p;
  iVar3 = -0x60;
  if ((end != puVar2 && -1 < (long)end - (long)puVar2) && (iVar3 = -0x62, *puVar2 == '\x03')) {
    *p = puVar2 + 1;
    iVar3 = mbedtls_asn1_get_len(p,end,&bs->len);
    if (iVar3 == 0) {
      iVar3 = -0x60;
      if (bs->len != 0) {
        sVar4 = bs->len - 1;
        bs->len = sVar4;
        pbVar5 = *p;
        bVar1 = *pbVar5;
        bs->unused_bits = bVar1;
        iVar3 = -100;
        if (bVar1 < 8) {
          pbVar5 = pbVar5 + 1;
          *p = pbVar5;
          bs->p = pbVar5;
          puVar2 = *p;
          *p = puVar2 + sVar4;
          iVar3 = -0x66;
          if (puVar2 + sVar4 == end) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_get_bitstring(unsigned char **p, const unsigned char *end,
                               mbedtls_asn1_bitstring *bs)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* Certificate type is a single byte bitstring */
    if ((ret = mbedtls_asn1_get_tag(p, end, &bs->len, MBEDTLS_ASN1_BIT_STRING)) != 0) {
        return ret;
    }

    /* Check length, subtract one for actual bit string length */
    if (bs->len < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }
    bs->len -= 1;

    /* Get number of unused bits, ensure unused bits <= 7 */
    bs->unused_bits = **p;
    if (bs->unused_bits > 7) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    (*p)++;

    /* Get actual bitstring */
    bs->p = *p;
    *p += bs->len;

    if (*p != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}